

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O3

void * alsa_update_rw(ALLEGRO_THREAD *self,void *arg)

{
  ALLEGRO_AUDIO_DEPTH depth;
  ALLEGRO_CHANNEL_CONF chan_conf;
  uint *puVar1;
  ALLEGRO_MUTEX *mutex;
  int iVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  undefined8 uVar9;
  undefined1 **ppuVar10;
  undefined1 *buf;
  uint samples;
  ulong uVar11;
  undefined1 *local_48;
  undefined8 local_40;
  uint iframes;
  int local_34;
  int bytes;
  
  ppuVar10 = &local_48;
  puVar1 = *(uint **)((long)arg + 0x50);
  cVar3 = _al_trace_prefix("alsa",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                           ,0x1a5,"alsa_update_rw");
  if (cVar3 != '\0') {
    _al_trace_suffix("ALSA update_rw thread started\n");
  }
  cVar3 = al_get_thread_should_stop(self);
  if (cVar3 == '\0') {
    local_34 = -1;
    ppuVar10 = &local_48;
    do {
      while( true ) {
        if ((*(char *)((long)puVar1 + 0x11) == '\x01') && (*(char *)((long)puVar1 + 0x12) == '\0'))
        {
          uVar9 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110d37;
          snd_pcm_drop(uVar9);
          uVar9 = *(undefined8 *)((long)arg + 0x30);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110d40;
          al_lock_mutex(uVar9);
          *(undefined1 *)((long)puVar1 + 0x12) = 1;
          uVar9 = *(undefined8 *)((long)arg + 0x38);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110d4e;
          al_signal_cond(uVar9);
          uVar9 = *(undefined8 *)((long)arg + 0x30);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110d57;
          al_unlock_mutex(uVar9);
        }
        if ((*(char *)((long)puVar1 + 0x11) == '\0') && (*(char *)((long)puVar1 + 0x12) == '\x01'))
        {
          *(undefined1 *)((long)puVar1 + 0x12) = 0;
        }
        if (*(char *)((long)puVar1 + 0x12) == '\x01') break;
        uVar9 = *(undefined8 *)(puVar1 + 0xc);
        *(undefined8 *)((long)ppuVar10 + -8) = 0x110dcb;
        iVar4 = snd_pcm_state(uVar9);
        iVar2 = local_34;
        if (iVar4 != local_34) {
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110df0;
          cVar3 = _al_trace_prefix("alsa",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1c1,"alsa_update_rw");
          iVar2 = iVar4;
          if (cVar3 != '\0') {
            *(undefined8 *)((long)ppuVar10 + -8) = 0x110dfc;
            snd_pcm_state_name(iVar4);
            *(undefined8 *)((long)ppuVar10 + -8) = 0x110e0d;
            _al_trace_suffix("state changed to: %s\n");
          }
        }
        local_34 = iVar2;
        if (iVar4 == 2) {
          uVar9 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110e71;
          uVar5 = snd_pcm_start(uVar9);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110e91;
          cVar3 = _al_trace_prefix("alsa",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1cb,"alsa_update_rw");
          if (cVar3 != '\0') {
            *(undefined8 *)((long)ppuVar10 + -8) = 0x110ea6;
            _al_trace_suffix("snd_pcm_start returned: %d\n",uVar5);
          }
LAB_00110ea6:
          uVar9 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110eb4;
          snd_pcm_wait(uVar9);
          uVar9 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110ebd;
          uVar6 = snd_pcm_avail_update(uVar9);
          if ((long)uVar6 < 0) {
            if (uVar6 != 0xffffffffffffffe0) {
              *(undefined8 *)((long)ppuVar10 + -8) = 0x110fd2;
              cVar3 = _al_trace_prefix("alsa",2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                       ,0x1d5,"alsa_update_rw");
              if (cVar3 != '\0') {
                *(undefined8 *)((long)ppuVar10 + -8) = 0x110fe5;
                uVar9 = snd_strerror(-(int)uVar6);
                *(undefined8 *)((long)ppuVar10 + -8) = 0x110ff6;
                _al_trace_suffix("Alsa r/w thread exited with error code %s.\n",uVar9);
              }
              goto LAB_00110cca;
            }
            uVar9 = *(undefined8 *)(puVar1 + 0xc);
            *(undefined8 *)((long)ppuVar10 + -8) = 0x110edf;
            snd_pcm_prepare(uVar9);
          }
          else if (uVar6 == 0) goto LAB_00110f92;
          uVar11 = *(ulong *)(puVar1 + 2);
          if (uVar6 < *(ulong *)(puVar1 + 2)) {
            uVar11 = uVar6;
          }
          samples = (uint)uVar11;
          iframes = *puVar1 * samples;
          buf = (undefined1 *)((long)ppuVar10 + -((ulong)iframes + 0xf & 0xfffffffffffffff0));
          local_48 = (undefined1 *)ppuVar10;
          if (*(char *)((long)arg + 0x28) == '\0') {
            if (*(char *)((long)puVar1 + 0x12) != '\0') goto LAB_00110f3e;
            *(undefined8 *)(buf + -8) = 0x110f60;
            alsa_update_nonstream_voice((ALLEGRO_VOICE *)arg,(void **)&local_40,(int *)&iframes);
            uVar11 = (ulong)iframes / (ulong)*puVar1;
            puVar7 = (undefined1 *)CONCAT44(local_40._4_4_,(uint)local_40);
          }
          else {
            if (*(char *)((long)puVar1 + 0x12) == '\0') {
              mutex = *(ALLEGRO_MUTEX **)((long)arg + 0x30);
              local_40._0_4_ = samples;
              *(undefined8 *)(buf + -8) = 0x110f2c;
              puVar7 = (undefined1 *)_al_voice_update((ALLEGRO_VOICE *)arg,mutex,(uint *)&local_40);
              if (puVar7 != (undefined1 *)0x0) {
                uVar11 = (ulong)(uint)local_40;
                goto LAB_00110f70;
              }
            }
LAB_00110f3e:
            depth = *arg;
            chan_conf = *(ALLEGRO_CHANNEL_CONF *)((long)arg + 4);
            *(undefined8 *)(buf + -8) = 0x110f4e;
            al_fill_silence(buf,samples,depth,chan_conf);
            puVar7 = buf;
          }
LAB_00110f70:
          uVar9 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)(buf + -8) = 0x110f7f;
          lVar8 = snd_pcm_writei(uVar9,puVar7,uVar11);
          ppuVar10 = (undefined1 **)local_48;
          if (lVar8 == -0x20) {
            uVar9 = *(undefined8 *)(puVar1 + 0xc);
            *(undefined8 *)(buf + -8) = 0x110f8e;
            snd_pcm_prepare(uVar9);
            ppuVar10 = (undefined1 **)local_48;
          }
        }
        else {
          if (iVar4 != 1) goto LAB_00110ea6;
          uVar9 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110e2a;
          snd_pcm_prepare(uVar9);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110e4a;
          cVar3 = _al_trace_prefix("alsa",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1c6,"alsa_update_rw");
          if (cVar3 != '\0') {
            *(undefined8 *)((long)ppuVar10 + -8) = 0x110e63;
            _al_trace_suffix("snd_pcm_prepare returned: %d\n");
          }
        }
LAB_00110f92:
        *(undefined8 *)((long)ppuVar10 + -8) = 0x110f9a;
        cVar3 = al_get_thread_should_stop(self);
        if (cVar3 != '\0') goto LAB_00110cca;
      }
      uVar9 = *(undefined8 *)((long)arg + 0x30);
      *(undefined8 *)((long)ppuVar10 + -8) = 0x110d7c;
      al_lock_mutex(uVar9);
      if (*(char *)((long)puVar1 + 0x11) == '\x01') {
        do {
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110d8c;
          cVar3 = al_get_thread_should_stop(self);
          if (cVar3 != '\0') break;
          uVar9 = *(undefined8 *)((long)arg + 0x38);
          *(undefined8 *)((long)ppuVar10 + -8) = 0x110d9d;
          al_wait_cond(uVar9);
        } while (*(char *)((long)puVar1 + 0x11) != '\0');
      }
      uVar9 = *(undefined8 *)((long)arg + 0x30);
      *(undefined8 *)((long)ppuVar10 + -8) = 0x110dad;
      al_unlock_mutex(uVar9);
      *(undefined8 *)((long)ppuVar10 + -8) = 0x110db5;
      cVar3 = al_get_thread_should_stop(self);
    } while (cVar3 == '\0');
  }
LAB_00110cca:
  *(undefined8 *)((long)ppuVar10 + -8) = 0x110cee;
  cVar3 = _al_trace_prefix("alsa",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                           ,0x1ff,"alsa_update_rw");
  if (cVar3 != '\0') {
    *(undefined8 *)((long)ppuVar10 + -8) = 0x110d00;
    _al_trace_suffix("ALSA update_rw thread stopped\n");
  }
  return (void *)0x0;
}

Assistant:

static void *alsa_update_rw(ALLEGRO_THREAD *self, void *arg)
{
   ALLEGRO_VOICE *voice = (ALLEGRO_VOICE*)arg;
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;
   snd_pcm_state_t last_state = -1;
   snd_pcm_state_t state;
   snd_pcm_uframes_t frames;
   snd_pcm_sframes_t err;

   ALLEGRO_INFO("ALSA update_rw thread started\n");

   while (!al_get_thread_should_stop(self)) {
      if (alsa_voice->stop && !alsa_voice->stopped) {
         snd_pcm_drop(alsa_voice->pcm_handle);
         al_lock_mutex(voice->mutex);
         alsa_voice->stopped = true;
         al_signal_cond(voice->cond);
         al_unlock_mutex(voice->mutex);
      }

      if (!alsa_voice->stop && alsa_voice->stopped) {
         alsa_voice->stopped = false;
      }

      if (alsa_voice->stopped) {
         /* Keep waiting while the voice is supposed to be stopped but present.
          */
         al_lock_mutex(voice->mutex);
         while (alsa_voice->stop && !al_get_thread_should_stop(self)) {
            al_wait_cond(voice->cond, voice->mutex);
         }
         al_unlock_mutex(voice->mutex);
         continue;
      }

      state = snd_pcm_state(alsa_voice->pcm_handle);
      if (state != last_state) {
         ALLEGRO_DEBUG("state changed to: %s\n", snd_pcm_state_name(state));
         last_state = state;
      }
      if (state == SND_PCM_STATE_SETUP) {
         int rc = snd_pcm_prepare(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_prepare returned: %d\n", rc);
         continue;
      }
      if (state == SND_PCM_STATE_PREPARED) {
         int rc = snd_pcm_start(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_start returned: %d\n", rc);
      }

      snd_pcm_wait(alsa_voice->pcm_handle, 10);
      err = snd_pcm_avail_update(alsa_voice->pcm_handle);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
         else {
            ALLEGRO_WARN("Alsa r/w thread exited "
               "with error code %s.\n", snd_strerror(-err));
            break;
         }
      }
      if (err == 0) {
         continue;
      }
      frames = err;
      if (frames > alsa_voice->frag_len)
         frames = alsa_voice->frag_len;
      /* Write sample data into the buffer. */
      int bytes = frames * alsa_voice->frame_size;
      uint8_t data[bytes];
      void *buf;
      if (!voice->is_streaming && !alsa_voice->stopped) {
         ASSERT(!alsa_voice->reversed); // FIXME
         alsa_update_nonstream_voice(voice, &buf, &bytes);
         frames = bytes / alsa_voice->frame_size;
      }
      else if (voice->is_streaming && !alsa_voice->stopped) {
         /* This should fit. */
         unsigned int iframes = frames;
         buf = (void *)_al_voice_update(voice, voice->mutex, &iframes);
         if (buf == NULL)
            goto silence;
         frames = iframes;
      }
      else {
silence:
         /* If stopped just fill with silence. */
         al_fill_silence(data, frames, voice->depth, voice->chan_conf);
         buf = data;
      }
      err = snd_pcm_writei(alsa_voice->pcm_handle, buf, frames);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
      }
   }

   ALLEGRO_INFO("ALSA update_rw thread stopped\n");

   return NULL;
}